

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawSwitchableImage::Parse
          (CommandDrawSwitchableImage *this,FScanner *sc,bool fullScreenOffsets)

{
  Condition CVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  PClass *pPVar4;
  ulong uVar5;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  bVar2 = FScanner::CheckToken(sc,0x102);
  if (!bVar2) {
    FScanner::MustGetToken(sc,0x101);
  }
  if (sc->TokenType == 0x101) {
    bVar2 = FScanner::Compare(sc,"weaponslot");
    if (bVar2) {
      this->condition = WEAPONSLOT;
      FScanner::MustGetToken(sc,0x104);
      this->conditionalValue[0] = sc->Number;
    }
    else {
      bVar2 = FScanner::Compare(sc,"invulnerable");
      if (bVar2) {
        this->condition = INVULNERABILITY;
      }
      else {
        bVar2 = FScanner::Compare(sc,"keyslot");
        if (bVar2) {
          this->condition = KEYSLOT;
          FScanner::MustGetToken(sc,0x104);
          iVar3 = sc->Number;
          this->conditionalValue[0] = iVar3;
          LookupKeySpecies(iVar3);
          this->keySpecies[0].Index = uStack_28._4_4_;
        }
        else {
          bVar2 = FScanner::Compare(sc,"armortype");
          if (bVar2) {
            this->condition = ARMORTYPE;
            FScanner::MustGetToken(sc,0x101);
            iVar3 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
            this->armorType[0] = iVar3;
            GetOperation(sc,this->conditionalOperator,this->conditionalValue);
          }
        }
      }
    }
  }
  if (this->condition == INVENTORY) {
    FString::operator=(this->inventoryItem,sc->String);
    iVar3 = FName::NameManager::FindName(&FName::NameData,sc->String,true);
    uStack_28 = CONCAT44(iVar3,(undefined4)uStack_28);
    pPVar4 = PClass::FindClass((FName *)((long)&uStack_28 + 4));
    if (pPVar4 == (PClass *)0x0) {
LAB_004c45f9:
      FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
    }
    else if (pPVar4 != AInventory::RegistrationInfo.MyClass) {
      do {
        pPVar4 = pPVar4->ParentClass;
        if (pPVar4 == AInventory::RegistrationInfo.MyClass) break;
      } while (pPVar4 != (PClass *)0x0);
      if (pPVar4 == (PClass *)0x0) goto LAB_004c45f9;
    }
    GetOperation(sc,this->conditionalOperator,this->conditionalValue);
  }
  bVar2 = FScanner::CheckToken(sc,0x11b);
  CVar1 = this->condition;
  if (CVar1 == INVULNERABILITY || !bVar2) goto LAB_004c4756;
  this->conditionAnd = true;
  if (CVar1 != WEAPONSLOT) {
    if (CVar1 == ARMORTYPE) {
      FScanner::MustGetToken(sc,0x101);
      iVar3 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
      this->armorType[1] = iVar3;
      goto LAB_004c4740;
    }
    if (CVar1 != KEYSLOT) {
      FScanner::MustGetToken(sc,0x101);
      FString::operator=(this->inventoryItem + 1,sc->String);
      iVar3 = FName::NameManager::FindName(&FName::NameData,sc->String,true);
      uStack_28 = CONCAT44(iVar3,(undefined4)uStack_28);
      pPVar4 = PClass::FindClass((FName *)((long)&uStack_28 + 4));
      if (pPVar4 == (PClass *)0x0) {
LAB_004c472c:
        FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
      }
      else if (pPVar4 != AInventory::RegistrationInfo.MyClass) {
        do {
          pPVar4 = pPVar4->ParentClass;
          if (pPVar4 == AInventory::RegistrationInfo.MyClass) break;
        } while (pPVar4 != (PClass *)0x0);
        if (pPVar4 == (PClass *)0x0) goto LAB_004c472c;
      }
LAB_004c4740:
      GetOperation(sc,this->conditionalOperator + 1,this->conditionalValue + 1);
      goto LAB_004c4756;
    }
  }
  FScanner::MustGetToken(sc,0x104);
  iVar3 = sc->Number;
  this->conditionalValue[1] = iVar3;
  if (this->condition == KEYSLOT) {
    LookupKeySpecies(iVar3);
    this->keySpecies[1].Index = uStack_28._4_4_;
  }
LAB_004c4756:
  uVar5 = 0;
  do {
    FScanner::MustGetToken(sc,0x2c);
    FScanner::MustGetToken(sc,0x102);
    iVar3 = SBarInfo::newImage((this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.
                               super_SBarInfoCommand.script,sc->String);
    this->conditionalImage[uVar5] = iVar3;
    if (this->conditionAnd != true) break;
    bVar2 = uVar5 < 2;
    uVar5 = uVar5 + 1;
  } while (bVar2);
  FScanner::MustGetToken(sc,0x2c);
  CommandDrawImage::Parse(&this->super_CommandDrawImage,sc,fullScreenOffsets);
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			if(sc.TokenType == TK_Identifier)
			{
				if(sc.Compare("weaponslot"))
				{
					condition = WEAPONSLOT;
					sc.MustGetToken(TK_IntConst);
					conditionalValue[0] = sc.Number;
				}
				else if(sc.Compare("invulnerable"))
				{
					condition = INVULNERABILITY;
				}
				else if(sc.Compare("keyslot"))
				{
					condition = KEYSLOT;
					sc.MustGetToken(TK_IntConst);
					conditionalValue[0] = sc.Number;
					keySpecies[0] = LookupKeySpecies(conditionalValue[0]);
				}
				else if(sc.Compare("armortype"))
				{
					condition = ARMORTYPE;
					sc.MustGetToken(TK_Identifier);
					armorType[0] = FName(sc.String).GetIndex();
					GetOperation(sc, conditionalOperator[0], conditionalValue[0]);
				}
			}
			if(condition == INVENTORY)
			{
				inventoryItem[0] = sc.String;
				const PClass* item = PClass::FindClass(sc.String);
				if(item == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(item)) //must be a kind of Inventory
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
				}
				GetOperation(sc, conditionalOperator[0], conditionalValue[0]);
			}
			if(sc.CheckToken(TK_AndAnd) && condition != INVULNERABILITY)
			{
				conditionAnd = true;
				if(condition == KEYSLOT || condition == WEAPONSLOT)
				{
					sc.MustGetToken(TK_IntConst);
					conditionalValue[1] = sc.Number;
					if(condition == KEYSLOT)
						keySpecies[1] = LookupKeySpecies(conditionalValue[1]);
				}
				else if(condition == ARMORTYPE)
				{
					sc.MustGetToken(TK_Identifier);
					armorType[1] = FName(sc.String).GetIndex();
					GetOperation(sc, conditionalOperator[1], conditionalValue[1]);
				}
				else
				{
					sc.MustGetToken(TK_Identifier);
					inventoryItem[1] = sc.String;
					const PClass* item = PClass::FindClass(sc.String);
					if(item == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(item)) //must be a kind of Inventory
					{
						sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					}
					GetOperation(sc, conditionalOperator[1], conditionalValue[1]);
				}
			}
			// [BL] I have word that MSVC++ wants this static_cast ;)  Shut up MSVC!
			for(unsigned int i = 0;i < (conditionAnd ? 3u : 1u);i++)
			{
				sc.MustGetToken(',');
				sc.MustGetToken(TK_StringConst);
				conditionalImage[i] = script->newImage(sc.String);
			}
			sc.MustGetToken(',');
			CommandDrawImage::Parse(sc, fullScreenOffsets);
		}